

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accelerometer-gyrometer.cpp
# Opt level: O2

void __thiscall
stateObservation::AccelerometerGyrometer::AccelerometerGyrometer(AccelerometerGyrometer *this)

{
  ConstantReturnType CStack_28;
  
  AlgebraicSensor::AlgebraicSensor(&this->super_AlgebraicSensor);
  (this->super_AlgebraicSensor).super_SensorBase._vptr_SensorBase =
       (_func_int **)&PTR__AccelerometerGyrometer_0025fc78;
  (this->super_LinearAcceleration)._vptr_LinearAcceleration =
       (_func_int **)&PTR__AccelerometerGyrometer_0025fd10;
  (this->super_RotationVelocity)._vptr_RotationVelocity =
       (_func_int **)&PTR__AccelerometerGyrometer_0025fd30;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&this->r_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&CStack_28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->acc_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&CStack_28);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&this->omega_,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&CStack_28);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&CStack_28,6,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)&this->output_,&CStack_28);
  this->currentStateSize_ = 10;
  this->matrixMode_ = false;
  return;
}

Assistant:

AccelerometerGyrometer::AccelerometerGyrometer():
    r_(Matrix3::Zero()),
    acc_(Vector3::Zero()),
    omega_(Vector3::Zero()),
    output_(Vector::Zero(measurementSize_,1)),
    currentStateSize_(stateSize_)
    {
#ifdef STATEOBSERVATION_VERBOUS_CONSTRUCTORS
      std::cout<<std::endl<<"AccelerometerGyrometer Constructor"<<std::endl;
#endif //STATEOBSERVATION_VERBOUS_CONSTRUCTOR

      matrixMode_=false;
    }